

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_allocator.h
# Opt level: O1

void * __thiscall
density::basic_default_allocator<65536UL>::allocate_page_zeroed
          (basic_default_allocator<65536UL> *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  long *in_FS_OFFSET;
  
  detail::PageAllocator<density::detail::SystemPageManager<65536ul>>::t_instance::__tls_init();
  pvVar1 = detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
           try_allocate_page<(density::detail::page_allocation_type)1>
                     ((PageAllocator<density::detail::SystemPageManager<65536UL>_> *)
                      (*in_FS_OFFSET + -0xc0),progress_blocking);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__throw_system_error;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void * allocate_page_zeroed()
        {
            auto const new_page =
              PageAllocator::thread_local_instance()
                .template try_allocate_page<detail::page_allocation_type::zeroed>(
                  progress_blocking);
            if (new_page == nullptr)
                throw std::bad_alloc();
            return new_page;
        }